

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImage2DDepthCase::createTexture(TexSubImage2DDepthCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  int iVar2;
  int height;
  TransferFormat TVar3;
  int iVar4;
  int iVar5;
  int ndx;
  int iVar6;
  deUint32 tex;
  ContextWrapper *local_d0;
  ulong local_c8;
  TransferFormat local_c0;
  Vec4 local_b8;
  Vec4 local_a8;
  TextureLevel levelData;
  PixelBufferAccess local_68;
  Random rnd;
  
  TVar3 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  tex = 0;
  local_c8 = (ulong)TVar3 >> 0x20;
  local_c0 = TVar3;
  local_68.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(TVar3.format,TVar3.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_68);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError(this_00);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xc3d);
  local_d0 = this_00;
  for (iVar6 = 0; iVar4 = (this->super_Texture2DSpecCase).m_numLevels, iVar6 < iVar4;
      iVar6 = iVar6 + 1) {
    iVar4 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar6 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar5 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar6 & 0x1f);
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    local_a8.m_data[0] = -1.5;
    local_a8.m_data[1] = -2.0;
    local_a8.m_data[2] = 1.7;
    local_a8.m_data[3] = -1.5;
    local_b8.m_data[0] = 2.0;
    local_b8.m_data[1] = 1.5;
    local_b8.m_data[2] = -1.0;
    local_b8.m_data[3] = 2.0;
    tcu::TextureLevel::setSize(&levelData,iVar4,iVar5,1);
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    tcu::fillWithComponentGradients(&local_68,&local_a8,&local_b8);
    iVar2 = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    sglr::ContextWrapper::glTexImage2D
              (local_d0,0xde1,iVar6,iVar2,iVar4,iVar5,0,local_c0.format,(deUint32)local_c8,
               local_68.super_ConstPixelBufferAccess.m_data);
  }
  for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + 1) {
    iVar4 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar6 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar5 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar6 & 0x1f);
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar4);
    height = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar5);
    iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar4 - iVar2);
    iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5 - height);
    local_a8.m_data[0] = 2.0;
    local_a8.m_data[1] = 1.5;
    local_a8.m_data[2] = -1.0;
    local_a8.m_data[3] = 2.0;
    local_b8.m_data[0] = -1.5;
    local_b8.m_data[1] = -2.0;
    local_b8.m_data[2] = 1.7;
    local_b8.m_data[3] = -1.5;
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    tcu::TextureLevel::setSize(&levelData,iVar2,height,1);
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    tcu::fillWithGrid(&local_68,dVar1 % 0xf + 2,&local_a8,&local_b8);
    tcu::TextureLevel::getAccess(&local_68,&levelData);
    sglr::ContextWrapper::glTexSubImage2D
              (local_d0,0xde1,iVar6,iVar4,iVar5,iVar2,height,local_c0.format,(deUint32)local_c8,
               local_68.super_ConstPixelBufferAccess.m_data);
    iVar4 = (this->super_Texture2DSpecCase).m_numLevels;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_width >> ndx);
			const int	levelH		= de::max(1, m_height >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelH);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelH-h);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, x, y, w, h, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}